

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClip.cpp
# Opt level: O0

PatternClip * __thiscall PatternClip::operator=(PatternClip *this,PatternClip *clip)

{
  undefined8 uVar1;
  int iVar2;
  PatternSelection local_40;
  undefined8 local_28;
  unique_ptr<char[],_std::default_delete<char[]>_> local_20;
  PatternClip *local_18;
  PatternClip *clip_local;
  PatternClip *this_local;
  
  local_28 = 0;
  local_18 = clip;
  clip_local = this;
  std::exchange<std::unique_ptr<char[],std::default_delete<char[]>>,decltype(nullptr)>
            (&local_20,(void **)clip);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=(&this->mData,&local_20);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_20);
  iVar2 = (local_18->mLocation).mEnd.super_PatternCursorBase.track;
  (this->mLocation).mEnd.super_PatternCursorBase.column =
       (local_18->mLocation).mEnd.super_PatternCursorBase.column;
  (this->mLocation).mEnd.super_PatternCursorBase.track = iVar2;
  iVar2 = (local_18->mLocation).mStart.super_PatternCursorBase.column;
  uVar1 = *(undefined8 *)&(local_18->mLocation).mStart.super_PatternCursorBase.track;
  (this->mLocation).mStart.super_PatternCursorBase.row =
       (local_18->mLocation).mStart.super_PatternCursorBase.row;
  (this->mLocation).mStart.super_PatternCursorBase.column = iVar2;
  *(undefined8 *)&(this->mLocation).mStart.super_PatternCursorBase.track = uVar1;
  PatternSelection::PatternSelection(&local_40);
  (local_18->mLocation).mStart.super_PatternCursorBase.row =
       local_40.mStart.super_PatternCursorBase.row;
  (local_18->mLocation).mStart.super_PatternCursorBase.column =
       local_40.mStart.super_PatternCursorBase.column;
  *(undefined8 *)&(local_18->mLocation).mStart.super_PatternCursorBase.track = local_40._8_8_;
  (local_18->mLocation).mEnd.super_PatternCursorBase.column =
       local_40.mEnd.super_PatternCursorBase.column;
  (local_18->mLocation).mEnd.super_PatternCursorBase.track =
       local_40.mEnd.super_PatternCursorBase.track;
  return this;
}

Assistant:

PatternClip& PatternClip::operator=(PatternClip &&clip) noexcept {
    // move the clips data to ours, resetting the clip's data
    mData = std::exchange(clip.mData, nullptr);
    mLocation = clip.mLocation;
    clip.mLocation = {};
    return *this;
}